

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

llb_buildsystem_tool_t *
llb_buildsystem_tool_create(llb_data_t *name,llb_buildsystem_tool_delegate_t delegate)

{
  uint64_t uVar1;
  uint8_t *puVar2;
  llb_buildsystem_tool_t *plVar3;
  
  if (delegate.create_command != (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_data_t_ptr *)0x0)
  {
    plVar3 = (llb_buildsystem_tool_t *)operator_new(0x48);
    uVar1 = name->length;
    puVar2 = name->data;
    *(undefined ***)plVar3 = &PTR__Tool_002426b0;
    *(llb_buildsystem_tool_t **)(plVar3 + 8) = plVar3 + 0x18;
    if (puVar2 == (uint8_t *)0x0) {
      *(undefined8 *)(plVar3 + 0x10) = 0;
      plVar3[0x18] = (llb_buildsystem_tool_t)0x0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)(plVar3 + 8),puVar2,puVar2 + uVar1);
    }
    *(undefined ***)plVar3 = &PTR__CAPITool_00242048;
    *(void **)(plVar3 + 0x28) = delegate.context;
    *(_func_llb_buildsystem_command_t_ptr_void_ptr_llb_data_t_ptr **)(plVar3 + 0x30) =
         delegate.create_command;
    *(_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr **)(plVar3 + 0x38) =
         delegate.create_custom_command;
    *(_func_void_void_ptr **)(plVar3 + 0x40) = delegate.destroy_context;
    return plVar3;
  }
  __assert_fail("delegate.create_command",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x510,
                "llb_buildsystem_tool_t *llb_buildsystem_tool_create(const llb_data_t *, llb_buildsystem_tool_delegate_t)"
               );
}

Assistant:

llb_buildsystem_tool_t*
llb_buildsystem_tool_create(const llb_data_t* name,
                            llb_buildsystem_tool_delegate_t delegate) {
  // Check that all required methods are provided.
  assert(delegate.create_command);
  return (llb_buildsystem_tool_t*) new CAPITool(
      StringRef((const char*)name->data, name->length), delegate);
}